

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O3

string * __thiscall
libtorrent::dht_pkt_alert::message_abi_cxx11_(string *__return_storage_ptr__,dht_pkt_alert *this)

{
  char *start;
  size_t sVar1;
  endpoint *ep;
  int iVar2;
  error_code ec;
  string msg;
  bdecode_node print;
  char buf [1024];
  error_code local_4b8;
  string local_4a8;
  undefined1 local_488 [44];
  int local_45c;
  int iStack_458;
  int iStack_454;
  int iStack_450;
  string local_448;
  char local_428 [1032];
  
  local_488._32_12_ = SUB1612((undefined1  [16])0x0,4);
  local_488._16_8_ = (pointer)0x0;
  local_488._24_4_ = 0;
  local_488._28_4_ = 0;
  local_488._0_16_ = (undefined1  [16])0x0;
  local_45c = -1;
  iStack_458 = -1;
  iStack_454 = -1;
  iStack_450 = -1;
  local_4b8.val_ = 0;
  local_4b8.failed_ = false;
  local_4b8.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  start = aux::stack_allocator::ptr
                    ((this->m_alloc)._M_data,(allocation_slot)(this->m_msg_idx).m_idx);
  iVar2 = 0;
  bdecode(start,start + this->m_size,(bdecode_node *)local_488,&local_4b8,(int *)0x0,100,100);
  print_entry_abi_cxx11_(&local_4a8,(libtorrent *)local_488,(bdecode_node *)0x1,false,iVar2);
  iVar2 = *(int *)((long)&_ZZNK10libtorrent13dht_pkt_alert7messageB5cxx11EvE6prefix_rel +
                  (ulong)this->direction * 4);
  print_endpoint_abi_cxx11_(&local_448,(libtorrent *)&this->node,ep);
  snprintf(local_428,0x400,"%s [%s] %s",
           (long)&_ZZNK10libtorrent13dht_pkt_alert7messageB5cxx11EvE6prefix_rel + (long)iVar2,
           local_448._M_dataplus._M_p,local_4a8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(local_428);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_428,local_428 + sVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_488._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_488._0_8_,local_488._16_8_ - local_488._0_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string dht_pkt_alert::message() const
	{
		bdecode_node print;
		error_code ec;

		// ignore errors here. This is best-effort. It may be a broken encoding
		// but at least we'll print the valid parts
		span<char const> pkt = pkt_buf();
		bdecode(pkt.data(), pkt.data() + int(pkt.size()), print, ec, nullptr, 100, 100);

		std::string msg = print_entry(print, true);

		static char const* const prefix[2] = {"<==", "==>"};
		char buf[1024];
		std::snprintf(buf, sizeof(buf), "%s [%s] %s", prefix[direction]
			, print_endpoint(node).c_str(), msg.c_str());

		return buf;
	}